

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.h
# Opt level: O2

bool __thiscall
dg::legacy::DataFlowAnalysis<dg::LLVMNode>::runOnBlock
          (DataFlowAnalysis<dg::LLVMNode> *this,BBlock<dg::LLVMNode> *B)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  _List_node_base *p_Var4;
  byte bVar5;
  
  bVar5 = 0;
  uVar3 = 0;
  p_Var4 = (_List_node_base *)&B->nodes;
  while (p_Var4 = (((_List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)&p_Var4->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&B->nodes) {
    uVar1 = p_Var4[1]._M_next;
    iVar2 = (*(this->super_BBlockDataFlowAnalysis<dg::LLVMNode>)._vptr_BBlockDataFlowAnalysis[1])
                      (this,uVar1,uVar3);
    bVar5 = bVar5 | (byte)iVar2;
    uVar3 = uVar1;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool runOnBlock(BBlock<NodeT> *B) override {
        bool changed = false;
        NodeT *prev = nullptr;

        for (NodeT *n : B->getNodes()) {
            changed |= runOnNode(n, prev);
            prev = n;
        }

        return changed;
    }